

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_binarymodelserialiser.cpp
# Opt level: O1

void BinaryModelSerialiser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined1 uVar1;
  
  if (_c != InvokeMetaMethod) {
switchD_0011c25e_default:
    return;
  }
  switch(_id) {
  case 0:
    uVar1 = (**(code **)(*(long *)_o + 0xa0))(_o,*_a[1]);
    break;
  case 1:
    uVar1 = (**(code **)(*(long *)_o + 0xa8))(_o,*_a[1]);
    break;
  case 2:
    uVar1 = (**(code **)(*(long *)_o + 0xb0))(_o,*_a[1]);
    break;
  case 3:
    uVar1 = (**(code **)(*(long *)_o + 0xb8))(_o,_a[1]);
    break;
  default:
    goto switchD_0011c25e_default;
  }
  if ((undefined1 *)*_a != (undefined1 *)0x0) {
    *(undefined1 *)*_a = uVar1;
  }
  return;
}

Assistant:

void BinaryModelSerialiser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<BinaryModelSerialiser *>(_o);
        (void)_t;
        switch (_id) {
        case 0: { bool _r = _t->saveModel((*reinterpret_cast< std::add_pointer_t<QIODevice*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 1: { bool _r = _t->saveModel((*reinterpret_cast< std::add_pointer_t<QByteArray*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 2: { bool _r = _t->loadModel((*reinterpret_cast< std::add_pointer_t<QIODevice*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 3: { bool _r = _t->loadModel((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
}